

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_concat.hpp
# Opt level: O0

detail * __thiscall
nlohmann::json_abi_v3_12_0::detail::
concat<std::__cxx11::string,std::__cxx11::string,char_const(&)[12],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string_const&>
          (detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [12],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          char (*args_3) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_4;
  char (*args_local_3) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  char (*args_local_1) [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  
  std::__cxx11::string::string((string *)this);
  concat_length<std::__cxx11::string,char[12],std::__cxx11::string,char[3],std::__cxx11::string,std::__cxx11::string>
            (args,args_1,args_2,args_3,args_4,args_5);
  std::__cxx11::string::reserve((ulong)this);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,args,args_1,
             args_2,args_3,args_4,args_5);
  return this;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(args...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}